

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

Pipeline * __thiscall CoreML::Specification::Model::mutable_pipeline(Model *this)

{
  Pipeline *this_00;
  
  if (this->_oneof_case_[0] == 0xca) {
    this_00 = (Pipeline *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0xca;
    this_00 = (Pipeline *)operator_new(0x48);
    Pipeline::Pipeline(this_00);
    (this->Type_).pipeline_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Pipeline* Model::mutable_pipeline() {
  if (!has_pipeline()) {
    clear_Type();
    set_has_pipeline();
    Type_.pipeline_ = new ::CoreML::Specification::Pipeline;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.pipeline)
  return Type_.pipeline_;
}